

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

int __thiscall MlmWrap::addHfTypeToSubbedList(MlmWrap *this,HFSubSockSettings *socketInfo)

{
  bool bVar1;
  int iVar2;
  HighFreqDataType nData;
  string local_f0;
  string local_d0;
  HighFreqDataType local_b0;
  
  HighFreqDataType::HighFreqDataType(&local_b0,&socketInfo->dataType);
  HighFreqDataType::getName_abi_cxx11_(&local_d0,&local_b0);
  HighFreqDataType::getOrigin_abi_cxx11_(&local_f0,&local_b0);
  bVar1 = isHfTypeCurrentlySubbed(this,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  iVar2 = -1;
  if (!bVar1) {
    iVar2 = 0;
    std::vector<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>::push_back
              (&this->subbedHfDataTypes,socketInfo);
  }
  HighFreqDataType::~HighFreqDataType(&local_b0);
  return iVar2;
}

Assistant:

int MlmWrap::addHfTypeToSubbedList(HFSubSockSettings socketInfo) {
    HighFreqDataType nData = socketInfo.dataType;
    if (isHfTypeCurrentlySubbed(nData.getName(), nData.getOrigin()))
        return(-1);
    subbedHfDataTypes.push_back(socketInfo);
    return(0);
}